

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O3

QStringList * __thiscall
QtPrivate::QCalendarRegistry::availableCalendars
          (QStringList *__return_storage_ptr__,QCalendarRegistry *this)

{
  Data *pDVar1;
  
  ensurePopulated(this);
  QReadWriteLock::lockForRead(&this->lock);
  pDVar1 = (this->byName).c.keys.d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->byName).c.keys.d.ptr;
  (__return_storage_ptr__->d).size = (this->byName).c.keys.d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QReadWriteLock::unlock(&this->lock);
  return __return_storage_ptr__;
}

Assistant:

QStringList QCalendarRegistry::availableCalendars()
{
    ensurePopulated();

    QReadLocker locker(&lock);
    return byName.keys();
}